

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall
ArenaVectorBase<ArenaVector<int>,_int>::reallocate
          (ArenaVectorBase<ArenaVector<int>,_int> *this,size_t size)

{
  int *piVar1;
  MixedArena *this_00;
  size_t sVar2;
  int *piVar3;
  size_t sVar4;
  
  piVar1 = this->data;
  this_00 = (MixedArena *)this[1].data;
  this->allocatedElements = size;
  piVar3 = (int *)MixedArena::allocSpace(this_00,size << 2,4);
  this->data = piVar3;
  sVar2 = this->usedElements;
  if (sVar2 != 0) {
    sVar4 = 0;
    do {
      piVar3[sVar4] = piVar1[sVar4];
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return;
}

Assistant:

void reallocate(size_t size) {
    T* old = data;
    static_cast<SubType*>(this)->allocate(size);
    for (size_t i = 0; i < usedElements; i++) {
      data[i] = old[i];
    }
  }